

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dsa_asn1.cc
# Opt level: O0

dsa_st * EVP_PKEY_get1_DSA(EVP_PKEY *pkey)

{
  DSA *r;
  DSA *dsa;
  EVP_PKEY *pkey_local;
  
  r = (DSA *)EVP_PKEY_get0_DSA((EVP_PKEY *)pkey);
  if (r != (DSA *)0x0) {
    DSA_up_ref(r);
  }
  return r;
}

Assistant:

DSA *EVP_PKEY_get1_DSA(const EVP_PKEY *pkey) {
  DSA *dsa = EVP_PKEY_get0_DSA(pkey);
  if (dsa != nullptr) {
    DSA_up_ref(dsa);
  }
  return dsa;
}